

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkSuite.hpp
# Opt level: O1

void benchmarks::detail::
     BenchmarksClassRegistrar<benchmarks::FunctionBenchmarks,_descriptors::function::boost::Regular>
     ::Register(BenchmarksMap *benchmarks)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer psVar2;
  FunctionBenchmarks<descriptors::function::boost::Regular> bm;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  undefined8 local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  undefined8 local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  ulong *local_148;
  undefined8 local_140;
  ulong local_138;
  undefined8 uStack_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined4 *local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined2 uStack_f2;
  undefined8 uStack_f0;
  pointer local_e8;
  _Rb_tree<benchmarks::BenchmarkId,std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>,std::_Select1st<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>,std::less<benchmarks::BenchmarkId>,std::allocator<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>>
  *local_e0;
  pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_> local_d8;
  FunctionBenchmarks<descriptors::function::boost::Regular> local_68;
  
  local_e0 = (_Rb_tree<benchmarks::BenchmarkId,std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>,std::_Select1st<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>,std::less<benchmarks::BenchmarkId>,std::allocator<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>>
              *)benchmarks;
  FunctionBenchmarks<descriptors::function::boost::Regular>::FunctionBenchmarks(&local_68);
  local_e8 = local_68.super_BenchmarksClass._benchmarks.
             super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_68.super_BenchmarksClass._benchmarks.
      super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.super_BenchmarksClass._benchmarks.
      super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar2 = local_68.super_BenchmarksClass._benchmarks.
             super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar1 = (psVar2->super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this = (psVar2->super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      local_128 = &local_118;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_68.super_BenchmarksClass._name._M_dataplus._M_p,
                 local_68.super_BenchmarksClass._name._M_dataplus._M_p +
                 local_68.super_BenchmarksClass._name._M_string_length);
      (*peVar1->_vptr_IBenchmark[2])(&local_1a8,peVar1);
      local_d8.first._className._M_string_length = local_120;
      local_d8.first._benchmarkName._M_string_length = local_1a0;
      uStack_f4 = 0x74;
      uStack_f3 = 0;
      local_188 = &local_178;
      if (local_128 == &local_118) {
        local_178._8_8_ = local_118._8_8_;
      }
      else {
        local_188 = local_128;
      }
      local_178._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
      local_178._M_local_buf[0] = local_118._M_local_buf[0];
      local_120 = 0;
      local_118._M_local_buf[0] = '\0';
      local_168 = &local_158;
      if (local_1a8 == &local_198) {
        local_158._8_8_ = local_198._8_8_;
      }
      else {
        local_168 = local_1a8;
      }
      local_158._M_allocated_capacity._1_7_ = local_198._M_allocated_capacity._1_7_;
      local_158._M_local_buf[0] = local_198._M_local_buf[0];
      local_1a0 = 0;
      local_198._M_local_buf[0] = '\0';
      local_d8.first._objectName.field_2._M_allocated_capacity = CONCAT26(uStack_f2,0x74736f6f62);
      uStack_130 = uStack_f0;
      local_100 = 0;
      local_f8 = 0x736f6f00;
      local_d8.first._className._M_dataplus._M_p = (pointer)&local_d8.first._className.field_2;
      if (local_188 == &local_178) {
        local_d8.first._className.field_2._8_8_ = local_178._8_8_;
      }
      else {
        local_d8.first._className._M_dataplus._M_p = (pointer)local_188;
      }
      local_d8.first._className.field_2._M_allocated_capacity = local_178._M_allocated_capacity;
      local_180 = 0;
      local_178._M_allocated_capacity = (ulong)(uint7)local_118._M_allocated_capacity._1_7_ << 8;
      local_d8.first._benchmarkName._M_dataplus._M_p =
           (pointer)&local_d8.first._benchmarkName.field_2;
      if (local_168 == &local_158) {
        local_d8.first._benchmarkName.field_2._8_8_ = local_158._8_8_;
      }
      else {
        local_d8.first._benchmarkName._M_dataplus._M_p = (pointer)local_168;
      }
      local_d8.first._benchmarkName.field_2._M_allocated_capacity = local_158._M_allocated_capacity;
      local_160 = 0;
      local_158._M_allocated_capacity = (ulong)(uint7)local_198._M_allocated_capacity._1_7_ << 8;
      local_d8.first._objectName._M_dataplus._M_p = (pointer)&local_d8.first._objectName.field_2;
      local_d8.first._objectName._M_string_length = 5;
      local_140 = 0;
      local_138 = local_d8.first._objectName.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      local_1a8 = &local_198;
      local_188 = &local_178;
      local_168 = &local_158;
      local_148 = &local_138;
      local_128 = &local_118;
      local_108 = &local_f8;
      local_d8.second.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = peVar1;
      local_d8.second.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = this;
      std::
      _Rb_tree<benchmarks::BenchmarkId,std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>,std::_Select1st<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>,std::less<benchmarks::BenchmarkId>,std::allocator<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>>
      ::
      _M_insert_unique<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>
                (local_e0,&local_d8);
      if (local_d8.second.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.second.
                   super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._objectName._M_dataplus._M_p != &local_d8.first._objectName.field_2) {
        operator_delete(local_d8.first._objectName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._benchmarkName._M_dataplus._M_p !=
          &local_d8.first._benchmarkName.field_2) {
        operator_delete(local_d8.first._benchmarkName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._className._M_dataplus._M_p != &local_d8.first._className.field_2) {
        operator_delete(local_d8.first._className._M_dataplus._M_p);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148);
      }
      if (local_168 != &local_158) {
        operator_delete(local_168);
      }
      if (local_188 != &local_178) {
        operator_delete(local_188);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8);
      }
      if (local_128 != &local_118) {
        operator_delete(local_128);
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      psVar2 = psVar2 + 1;
    } while (psVar2 != local_e8);
  }
  std::
  vector<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
  ::~vector(&local_68.super_BenchmarksClass._benchmarks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.super_BenchmarksClass._name._M_dataplus._M_p !=
      &local_68.super_BenchmarksClass._name.field_2) {
    operator_delete(local_68.super_BenchmarksClass._name._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void Register(BenchmarksMap& benchmarks)
			{
				BenchmarksClass_<ObjectsDescHead_> bm;
				for (auto b : bm.GetBenchmarks())
					benchmarks.insert({BenchmarkId(bm.GetName(), b->GetName(), ObjectsDescHead_::GetName()), b});

				BenchmarksClassRegistrar<BenchmarksClass_, ObjectsDescTail_...>::Register(benchmarks);
			}